

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall
TimesAll<0,0,0>::propagate_xy<0,0>
          (TimesAll<0,_0,_0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,
          int64_t z_min,int64_t z_max)

{
  IntView<0> v_00;
  IntView<0> v_01;
  IntView<0> u_00;
  IntView<0> u_01;
  IntView<0> v_02;
  IntView<0> v_03;
  IntView<0> u_02;
  IntView<0> u_03;
  bool bVar1;
  Lit LVar2;
  Lit *pLVar3;
  int64_t in_RCX;
  TimesAll<0,_0,_0> *in_RDX;
  int64_t in_RSI;
  int64_t in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  Reason m_r_5;
  int64_t m_v_5;
  Clause *reason_4;
  Reason m_r_4;
  int64_t m_v_4;
  Clause *reason_3;
  Reason m_r_3;
  int64_t m_v_3;
  Clause *reason_2;
  Reason m_r_2;
  int64_t m_v_2;
  Clause *reason_1;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  Clause *reason;
  IntView<0> *in_stack_fffffffffffffe38;
  undefined1 uVar4;
  IntView<0> *in_stack_fffffffffffffe40;
  int sz;
  IntView<0> *in_stack_fffffffffffffe48;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffe50;
  int64_t in_stack_fffffffffffffe90;
  TimesAll<0,_0,_0> *in_stack_fffffffffffffe98;
  IntVar *in_stack_fffffffffffffea0;
  Reason in_stack_fffffffffffffea8;
  int64_t in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  IntVar *in_stack_fffffffffffffec0;
  Clause *c;
  undefined8 in_stack_fffffffffffffec8;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Clause *local_118;
  int64_t in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  int64_t in_stack_ffffffffffffff00;
  Reason local_c8;
  undefined8 local_c0;
  int local_b8;
  int local_b4;
  Clause *local_b0;
  anon_union_8_2_743a5d44_for_Reason_0 local_a8;
  anon_union_8_2_743a5d44_for_Reason_0 local_a0;
  undefined8 local_98;
  int local_90;
  int local_8c;
  Clause *local_88;
  anon_union_8_2_743a5d44_for_Reason_0 local_80;
  anon_union_8_2_743a5d44_for_Reason_0 local_78;
  undefined8 local_70;
  anon_union_8_2_743a5d44_for_Reason_0 local_68;
  anon_union_8_2_743a5d44_for_Reason_0 local_60;
  undefined8 local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  Clause *local_40;
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  
  sz = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  if ((in_stack_00000010 == 0) && (in_stack_00000018 == 0)) {
    if ((0 < in_R9) || (in_stack_00000008 < 0)) {
      local_40 = (Clause *)0x0;
      if (so.lazy) {
        local_40 = ::Reason_new(sz);
        local_44 = (int)IntView<0>::getMinLit(in_stack_fffffffffffffe38);
        pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                    (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        pLVar3->x = local_44;
        local_48 = (int)IntView<0>::getMaxLit(in_stack_fffffffffffffe38);
        pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                    (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        pLVar3->x = local_48;
        local_4c = (int)IntView<0>::getMinLit(in_stack_fffffffffffffe38);
        pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                    (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        pLVar3->x = local_4c;
        local_50 = (int)IntView<0>::getMaxLit(in_stack_fffffffffffffe38);
        pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                    (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        pLVar3->x = local_50;
      }
      local_58 = 0;
      bVar1 = IntView<0>::setMinNotR(in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38);
      if (bVar1) {
        Reason::Reason((Reason *)&local_60,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          Reason::Reason((Reason *)&local_60,local_40);
        }
        local_68 = local_60;
        bVar1 = IntView<0>::setMin(in_stack_fffffffffffffe48,(int64_t)in_stack_fffffffffffffe40,
                                   (Reason)in_stack_fffffffffffffe50,
                                   SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
        if (!bVar1) {
          return false;
        }
      }
      local_70 = 0;
      bVar1 = IntView<0>::setMaxNotR(in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38);
      uVar4 = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
      if (bVar1) {
        Reason::Reason((Reason *)&local_78,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          Reason::Reason((Reason *)&local_78,local_40);
        }
        local_80 = local_78;
        bVar1 = IntView<0>::setMax(in_stack_fffffffffffffe48,(int64_t)in_stack_fffffffffffffe40,
                                   (Reason)in_stack_fffffffffffffe50,(bool)uVar4);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  else if (in_stack_00000010 < 1) {
    if (in_stack_00000018 < 0) {
      if (in_R9 == 0) {
        local_118 = (Clause *)0x0;
        if (so.lazy) {
          local_118 = ::Reason_new(sz);
          LVar2 = IntView<0>::getMaxLit(in_stack_fffffffffffffe38);
          pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                      (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
          pLVar3->x = LVar2.x;
          LVar2 = IntView<0>::getMinLit(in_stack_fffffffffffffe38);
          pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                      (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
          pLVar3->x = LVar2.x;
        }
        bVar1 = IntView<0>::setMinNotR(in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38)
        ;
        uVar4 = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
        if (bVar1) {
          Reason::Reason((Reason *)&stack0xfffffffffffffed0,(Clause *)0x0);
          if ((so.lazy & 1U) != 0) {
            Reason::Reason((Reason *)&stack0xfffffffffffffed0,local_118);
          }
          bVar1 = IntView<0>::setMin(in_stack_fffffffffffffe48,(int64_t)in_stack_fffffffffffffe40,
                                     (Reason)in_stack_fffffffffffffe50,(bool)uVar4);
          if (!bVar1) {
            return false;
          }
        }
      }
      else if (in_stack_00000008 == 0) {
        c = (Clause *)0x0;
        if (so.lazy) {
          c = ::Reason_new(sz);
          LVar2 = IntView<0>::getMaxLit(in_stack_fffffffffffffe38);
          pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                      (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
          pLVar3->x = LVar2.x;
          LVar2 = IntView<0>::getMaxLit(in_stack_fffffffffffffe38);
          pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                      (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
          pLVar3->x = LVar2.x;
        }
        bVar1 = IntView<0>::setMaxNotR(in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38)
        ;
        uVar4 = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
        if (bVar1) {
          Reason::Reason((Reason *)&stack0xfffffffffffffea8,(Clause *)0x0);
          if ((so.lazy & 1U) != 0) {
            Reason::Reason((Reason *)&stack0xfffffffffffffea8,c);
          }
          bVar1 = IntView<0>::setMax(in_stack_fffffffffffffe48,(int64_t)in_stack_fffffffffffffe40,
                                     (Reason)in_stack_fffffffffffffe50,(bool)uVar4);
          if (!bVar1) {
            return false;
          }
        }
      }
      else {
        u_01.a = in_stack_fffffffffffffeb8;
        u_01.var = (IntVar *)in_stack_fffffffffffffeb0;
        u_01.b = in_stack_fffffffffffffebc;
        v_01._8_8_ = in_stack_fffffffffffffea8.field_0;
        v_01.var = in_stack_fffffffffffffea0;
        bVar1 = propagate_xy_min<0,0>
                          (in_RDX,u_01,v_01,in_RSI,in_stack_fffffffffffffed0._a,
                           in_stack_fffffffffffffed8,
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        if (!bVar1) {
          return false;
        }
        u_03.a = (int)in_stack_fffffffffffffed8;
        u_03.b = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        u_03.var = (IntVar *)in_stack_fffffffffffffed0._pt;
        v_03.a = (int)in_stack_fffffffffffffec8;
        v_03.b = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
        v_03.var = in_stack_fffffffffffffec0;
        bVar1 = propagate_xy_max<0,0>
                          ((TimesAll<0,_0,_0> *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),u_03,v_03,
                           in_stack_fffffffffffffeb0,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  else if (in_R9 == 0) {
    local_88 = (Clause *)0x0;
    if (so.lazy) {
      local_88 = ::Reason_new(sz);
      local_8c = (int)IntView<0>::getMinLit(in_stack_fffffffffffffe38);
      pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                  (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      pLVar3->x = local_8c;
      local_90 = (int)IntView<0>::getMinLit(in_stack_fffffffffffffe38);
      pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                  (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      pLVar3->x = local_90;
    }
    local_98 = 1;
    bVar1 = IntView<0>::setMinNotR(in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38);
    uVar4 = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
    if (bVar1) {
      Reason::Reason((Reason *)&local_a0,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        Reason::Reason((Reason *)&local_a0,local_88);
      }
      local_a8 = local_a0;
      bVar1 = IntView<0>::setMin(in_stack_fffffffffffffe48,(int64_t)in_stack_fffffffffffffe40,
                                 (Reason)in_stack_fffffffffffffe50,(bool)uVar4);
      if (!bVar1) {
        return false;
      }
    }
  }
  else if (in_stack_00000008 == 0) {
    local_b0 = (Clause *)0x0;
    if (so.lazy) {
      local_b0 = ::Reason_new(sz);
      local_b4 = (int)IntView<0>::getMinLit(in_stack_fffffffffffffe38);
      pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                  (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      pLVar3->x = local_b4;
      local_b8 = (int)IntView<0>::getMaxLit(in_stack_fffffffffffffe38);
      pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe40,
                                  (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      pLVar3->x = local_b8;
    }
    local_c0 = 0xffffffffffffffff;
    bVar1 = IntView<0>::setMaxNotR(in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38);
    uVar4 = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
    if (bVar1) {
      Reason::Reason(&local_c8,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        Reason::Reason(&local_c8,local_b0);
      }
      bVar1 = IntView<0>::setMax(in_stack_fffffffffffffe48,(int64_t)in_stack_fffffffffffffe40,
                                 (Reason)in_stack_fffffffffffffe50,(bool)uVar4);
      if (!bVar1) {
        return false;
      }
    }
  }
  else {
    u_00.a = in_stack_fffffffffffffeb8;
    u_00.var = (IntVar *)in_stack_fffffffffffffeb0;
    u_00.b = in_stack_fffffffffffffebc;
    v_00._8_8_ = in_stack_fffffffffffffea8.field_0;
    v_00.var = in_stack_fffffffffffffea0;
    local_28 = in_RCX;
    local_20 = in_R8;
    local_18 = in_RSI;
    bVar1 = propagate_xy_min<0,0>
                      (in_stack_fffffffffffffe98,u_00,v_00,in_stack_fffffffffffffe90,
                       in_stack_fffffffffffffed0._a,in_stack_fffffffffffffed8,
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (!bVar1) {
      return false;
    }
    u_02.a = (int)in_stack_fffffffffffffed8;
    u_02.b = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    u_02.var = (IntVar *)in_stack_fffffffffffffed0._pt;
    v_02.a = (int)in_stack_fffffffffffffec8;
    v_02.b = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    v_02.var = in_stack_fffffffffffffec0;
    bVar1 = propagate_xy_max<0,0>
                      ((TimesAll<0,_0,_0> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),u_02,v_02,
                       in_stack_fffffffffffffeb0,local_28,local_20,local_18);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate_xy(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
										const int64_t z_min, const int64_t z_max) {
		if (z_min == 0 && z_max == 0) {
			// The product z equals to 0. Then x must equal to 0 too if y cannot be 0.
			if (v_min > 0 || v_max < 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(5);
					(*reason)[1] = v.getMinLit();
					(*reason)[2] = v.getMaxLit();
					(*reason)[3] = z.getMinLit();
					(*reason)[4] = z.getMaxLit();
				}
				setDom(u, setMin, 0, reason);
				setDom(u, setMax, 0, reason);
			}
		} else if (z_min > 0) {
			if (v_min == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMinLit();
					(*reason)[2] = v.getMinLit();
				}
				setDom(v, setMin, 1, reason);
			} else if (v_max == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMinLit();
					(*reason)[2] = v.getMaxLit();
				}
				setDom(v, setMax, -1, reason);
			} else {
				if (!propagate_xy_min(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
				if (!propagate_xy_max(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
			}
		} else if (z_max < 0) {
			if (v_min == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMaxLit();
					(*reason)[2] = v.getMinLit();
				}
				setDom(v, setMin, 1, reason);
			} else if (v_max == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMaxLit();
					(*reason)[2] = v.getMaxLit();
				}
				setDom(v, setMax, -1, reason);
			} else {
				if (!propagate_xy_min(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
				if (!propagate_xy_max(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
			}
		}
		return true;
	}